

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.cpp
# Opt level: O2

void __thiscall Clasp::PropagatorList::add(PropagatorList *this,PostPropagator *p)

{
  PostPropagator *pPVar1;
  uint uVar2;
  uint uVar3;
  
  if ((p == (PostPropagator *)0x0) || (p->next != (PostPropagator *)0x0)) {
    Potassco::fail(-2,"void Clasp::PropagatorList::add(PostPropagator *)",0x4a,"p && p->next == 0",
                   "Invalid post propagator",0);
  }
  uVar2 = (*(p->super_Constraint)._vptr_Constraint[0x12])(p);
  while (pPVar1 = this->head_, pPVar1 != (PostPropagator *)0x0) {
    uVar3 = (*(pPVar1->super_Constraint)._vptr_Constraint[0x12])(pPVar1);
    if (uVar2 < uVar3) break;
    this = (PropagatorList *)&pPVar1->next;
  }
  p->next = pPVar1;
  *this = (PropagatorList)p;
  return;
}

Assistant:

void PropagatorList::add(PostPropagator* p) {
	POTASSCO_REQUIRE(p && p->next == 0, "Invalid post propagator");
	uint32 prio = p->priority();
	for (PostPropagator** r = head(), *x;; r = &x->next) {
		if ((x = *r) == 0 || prio < (uint32)x->priority()) {
			p->next = x;
			*r      = p;
			break;
		}
	}
}